

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O0

REF_STATUS
ref_iso_cast(REF_GRID *iso_grid_ptr,REF_DBL **iso_field_ptr,REF_GRID ref_grid,REF_DBL *field,
            REF_INT ldim,REF_DBL *segment0,REF_DBL *segment1)

{
  int iVar1;
  uint uVar2;
  REF_STATUS RVar3;
  REF_MPI pRVar4;
  long lVar5;
  double local_380;
  double local_378;
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_INT new_cell_1;
  REF_INT new_nodes_1 [27];
  int local_2c4;
  REF_INT faces [4];
  int local_2ac;
  REF_CELL_TYPE local_2a8;
  REF_INT nface;
  REF_INT face_nodes [4];
  int local_28c;
  int local_288;
  REF_INT node_2;
  REF_INT cell_face;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_INT new_cell;
  REF_INT new_nodes [27];
  int local_200 [2];
  REF_INT edges [3];
  REF_INT nedge;
  REF_INT edge_nodes [2];
  REF_INT node_1;
  REF_INT cell_edge;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_INT node;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_INT ref_malloc_init_i_1;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *iso_field;
  REF_INT id;
  REF_DBL t1;
  REF_DBL t0;
  REF_DBL inside;
  REF_DBL tuvw [4];
  REF_DBL ss [2];
  REF_DBL tt [2];
  REF_DBL triangle2 [3];
  REF_DBL local_118;
  REF_DBL triangle1 [3];
  REF_DBL local_f8;
  REF_DBL triangle0 [3];
  REF_DBL local_d8;
  REF_DBL candidate1 [3];
  REF_DBL local_b8;
  REF_DBL candidate0 [3];
  void *local_98;
  REF_INT *new_node;
  REF_GLOB global;
  REF_INT cell;
  REF_INT part;
  REF_INT j;
  REF_INT i;
  REF_INT face;
  REF_INT edge;
  REF_FACE ref_face;
  REF_EDGE ref_edge;
  REF_GRID iso_grid;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_DBL *segment0_local;
  REF_DBL *pRStack_30;
  REF_INT ldim_local;
  REF_DBL *field_local;
  REF_GRID ref_grid_local;
  REF_DBL **iso_field_ptr_local;
  REF_GRID *iso_grid_ptr_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  ref_cell = (REF_CELL)ref_grid->node;
  iso_grid = (REF_GRID)0x0;
  ref_face = (REF_FACE)0x0;
  _face = (REF_FACE)0x0;
  ref_mpi = (REF_MPI)segment0;
  segment0_local._4_4_ = ldim;
  pRStack_30 = field;
  field_local = (REF_DBL *)ref_grid;
  ref_grid_local = (REF_GRID)iso_field_ptr;
  iso_field_ptr_local = (REF_DBL **)iso_grid_ptr;
  uVar2 = ref_node_synchronize_globals((REF_NODE)ref_cell);
  if (uVar2 == 0) {
    uVar2 = ref_grid_create((REF_GRID *)iso_field_ptr_local,(REF_MPI)ref_node);
    if (uVar2 == 0) {
      ref_edge = (REF_EDGE)*iso_field_ptr_local;
      *(undefined4 *)&ref_edge[8].e2n = *(undefined4 *)(field_local + 0x21);
      uVar2 = ref_node_initialize_n_global((REF_NODE)ref_edge->e2n,0);
      if (uVar2 == 0) {
        if (*(int *)(field_local + 0x21) == 0) {
          uVar2 = ref_face_create((REF_FACE *)&face,(REF_GRID)field_local);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x239,"ref_iso_cast",(ulong)uVar2,"create face");
            return uVar2;
          }
          if (_face->n < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x23a,"ref_iso_cast","malloc new_node of REF_INT negative");
            return 1;
          }
          local_98 = malloc((long)_face->n << 2);
          if (local_98 == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x23a,"ref_iso_cast","malloc new_node of REF_INT NULL");
            return 2;
          }
          for (ref_private_macro_code_rss_9 = 0; ref_private_macro_code_rss_9 < _face->n;
              ref_private_macro_code_rss_9 = ref_private_macro_code_rss_9 + 1) {
            *(undefined4 *)((long)local_98 + (long)ref_private_macro_code_rss_9 * 4) = 0xffffffff;
          }
          for (j = 0; j < _face->n; j = j + 1) {
            for (part = 0; part < 3; part = part + 1) {
              triangle0[(long)part + -1] =
                   *(REF_DBL *)(ref_cell->c2n + (long)(part + _face->f2n[j << 2] * 0xf) * 2);
              triangle1[(long)part + -1] =
                   *(REF_DBL *)(ref_cell->c2n + (long)(part + _face->f2n[j * 4 + 1] * 0xf) * 2);
              tt[(long)part + 1] =
                   *(REF_DBL *)(ref_cell->c2n + (long)(part + _face->f2n[j * 4 + 2] * 0xf) * 2);
            }
            RVar3 = ref_iso_triangle_segment
                              (&local_f8,&local_118,tt + 1,(REF_DBL *)ref_mpi,segment1,&inside);
            if (RVar3 == 0) {
              if (tuvw[1] <= tuvw[0]) {
                local_368 = tuvw[1];
              }
              else {
                local_368 = tuvw[0];
              }
              if (tuvw[2] <= local_368) {
                local_378 = tuvw[2];
              }
              else {
                if (tuvw[1] <= tuvw[0]) {
                  local_370 = tuvw[1];
                }
                else {
                  local_370 = tuvw[0];
                }
                local_378 = local_370;
              }
              if (0.0 <= local_378) {
                if (1.0 - inside <= inside) {
                  local_380 = 1.0 - inside;
                }
                else {
                  local_380 = inside;
                }
                if (0.0 <= local_380) {
                  uVar2 = ref_face_part(_face,(REF_NODE)ref_cell,j,(REF_INT *)((long)&global + 4));
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                           ,0x24d,"ref_iso_cast",(ulong)uVar2,"face part");
                    return uVar2;
                  }
                  if (ref_node->max == global._4_4_) {
                    uVar2 = ref_node_next_global((REF_NODE)ref_edge->e2n,(REF_GLOB *)&new_node);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                             ,0x250,"ref_iso_cast",(ulong)uVar2,"next global");
                      return uVar2;
                    }
                    uVar2 = ref_node_add((REF_NODE)ref_edge->e2n,(REF_GLOB)new_node,
                                         (REF_INT *)((long)local_98 + (long)j * 4));
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                             ,0x252,"ref_iso_cast",(ulong)uVar2,"add node");
                      return uVar2;
                    }
                    for (part = 0; part < 3; part = part + 1) {
                      *(double *)
                       (*(long *)(ref_edge->e2n + 0xe) +
                       (long)(part + *(int *)((long)local_98 + (long)j * 4) * 0xf) * 8) =
                           inside * segment1[part] +
                           (1.0 - inside) * *(double *)(&ref_mpi->n + (long)part * 2);
                    }
                  }
                }
              }
            }
          }
        }
        else {
          uVar2 = ref_edge_create((REF_EDGE *)&ref_face,(REF_GRID)field_local);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x21b,"ref_iso_cast",(ulong)uVar2,"create edge");
            return uVar2;
          }
          if (ref_face->n < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x21c,"ref_iso_cast","malloc new_node of REF_INT negative");
            return 1;
          }
          local_98 = malloc((long)ref_face->n << 2);
          if (local_98 == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x21c,"ref_iso_cast","malloc new_node of REF_INT NULL");
            return 2;
          }
          for (ref_private_macro_code_rss_5 = 0; ref_private_macro_code_rss_5 < ref_face->n;
              ref_private_macro_code_rss_5 = ref_private_macro_code_rss_5 + 1) {
            *(undefined4 *)((long)local_98 + (long)ref_private_macro_code_rss_5 * 4) = 0xffffffff;
          }
          for (i = 0; i < ref_face->n; i = i + 1) {
            for (part = 0; part < 3; part = part + 1) {
              candidate0[(long)part + -1] =
                   *(REF_DBL *)(ref_cell->c2n + (long)(part + ref_face->f2n[i << 1] * 0xf) * 2);
              candidate1[(long)part + -1] =
                   *(REF_DBL *)(ref_cell->c2n + (long)(part + ref_face->f2n[i * 2 + 1] * 0xf) * 2);
            }
            RVar3 = ref_iso_segment_segment(&local_b8,&local_d8,(REF_DBL *)ref_mpi,segment1,ss + 1);
            if (RVar3 == 0) {
              tuvw[3] = 1.0 - ss[1];
              ss[0] = 1.0 - tt[0];
              local_358 = tuvw[3];
              if (ss[1] < tuvw[3]) {
                local_358 = ss[1];
              }
              if (0.0 <= local_358) {
                local_360 = ss[0];
                if (tt[0] < ss[0]) {
                  local_360 = tt[0];
                }
                if (0.0 <= local_360) {
                  uVar2 = ref_edge_part((REF_EDGE)ref_face,i,(REF_INT *)((long)&global + 4));
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                           ,0x22c,"ref_iso_cast",(ulong)uVar2,"edge part");
                    return uVar2;
                  }
                  if (ref_node->max == global._4_4_) {
                    uVar2 = ref_node_next_global((REF_NODE)ref_edge->e2n,(REF_GLOB *)&new_node);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                             ,0x22f,"ref_iso_cast",(ulong)uVar2,"next global");
                      return uVar2;
                    }
                    uVar2 = ref_node_add((REF_NODE)ref_edge->e2n,(REF_GLOB)new_node,
                                         (REF_INT *)((long)local_98 + (long)i * 4));
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                             ,0x231,"ref_iso_cast",(ulong)uVar2,"add node");
                      return uVar2;
                    }
                    for (part = 0; part < 3; part = part + 1) {
                      *(double *)
                       (*(long *)(ref_edge->e2n + 0xe) +
                       (long)(part + *(int *)((long)local_98 + (long)i * 4) * 0xf) * 8) =
                           ss[0] * candidate1[(long)part + -1] + tt[0] * candidate0[(long)part + -1]
                      ;
                    }
                  }
                }
              }
            }
          }
        }
        if (pRStack_30 == (REF_DBL *)0x0) {
          ref_grid_local->mpi = (REF_MPI)0x0;
        }
        else {
          if (segment0_local._4_4_ * ref_edge->e2n[1] < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x261,"ref_iso_cast","malloc *iso_field_ptr of REF_DBL negative");
            return 1;
          }
          pRVar4 = (REF_MPI)malloc((long)(segment0_local._4_4_ * ref_edge->e2n[1]) << 3);
          ref_grid_local->mpi = pRVar4;
          if (ref_grid_local->mpi == (REF_MPI)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x261,"ref_iso_cast","malloc *iso_field_ptr of REF_DBL NULL");
            return 2;
          }
          pRVar4 = ref_grid_local->mpi;
          if (*(int *)(field_local + 0x21) == 0) {
            for (j = 0; j < _face->n; j = j + 1) {
              iVar1 = *(int *)((long)local_98 + (long)j * 4);
              if (iVar1 != -1) {
                for (part = 0; part < 3; part = part + 1) {
                  triangle0[(long)part + -1] =
                       *(REF_DBL *)(ref_cell->c2n + (long)(part + _face->f2n[j << 2] * 0xf) * 2);
                  triangle1[(long)part + -1] =
                       *(REF_DBL *)(ref_cell->c2n + (long)(part + _face->f2n[j * 4 + 1] * 0xf) * 2);
                  tt[(long)part + 1] =
                       *(REF_DBL *)(ref_cell->c2n + (long)(part + _face->f2n[j * 4 + 2] * 0xf) * 2);
                }
                uVar2 = ref_iso_triangle_segment
                                  (&local_f8,&local_118,tt + 1,(REF_DBL *)ref_mpi,segment1,&inside);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x287,"ref_iso_cast",(ulong)uVar2,"tuvw");
                  return uVar2;
                }
                for (cell = 0; cell < segment0_local._4_4_; cell = cell + 1) {
                  *(undefined8 *)(&pRVar4->n + (long)(cell + segment0_local._4_4_ * iVar1) * 2) = 0;
                  for (part = 0; part < 3; part = part + 1) {
                    lVar5 = (long)(cell + segment0_local._4_4_ * iVar1);
                    *(double *)(&pRVar4->n + lVar5 * 2) =
                         tuvw[(long)(part + 1) + -1] *
                         pRStack_30[cell + segment0_local._4_4_ * _face->f2n[part + j * 4]] +
                         *(double *)(&pRVar4->n + lVar5 * 2);
                  }
                }
              }
            }
          }
          else {
            for (i = 0; i < ref_face->n; i = i + 1) {
              iVar1 = *(int *)((long)local_98 + (long)i * 4);
              if (iVar1 != -1) {
                for (part = 0; part < 3; part = part + 1) {
                  candidate0[(long)part + -1] =
                       *(REF_DBL *)(ref_cell->c2n + (long)(part + ref_face->f2n[i << 1] * 0xf) * 2);
                  candidate1[(long)part + -1] =
                       *(REF_DBL *)
                        (ref_cell->c2n + (long)(part + ref_face->f2n[i * 2 + 1] * 0xf) * 2);
                }
                uVar2 = ref_iso_segment_segment
                                  (&local_b8,&local_d8,(REF_DBL *)ref_mpi,segment1,ss + 1);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x26f,"ref_iso_cast",(ulong)uVar2,"seg-seg");
                  return uVar2;
                }
                tuvw[3] = 1.0 - ss[1];
                ss[0] = 1.0 - tt[0];
                for (cell = 0; cell < segment0_local._4_4_; cell = cell + 1) {
                  *(double *)(&pRVar4->n + (long)(cell + segment0_local._4_4_ * iVar1) * 2) =
                       ss[0] * pRStack_30[cell + segment0_local._4_4_ * ref_face->f2n[i << 1]] +
                       tt[0] * pRStack_30[cell + segment0_local._4_4_ * ref_face->f2n[i * 2 + 1]];
                }
              }
            }
          }
        }
        if (*(int *)(field_local + 0x21) == 0) {
          iso_grid = (REF_GRID)field_local[10];
          for (global._0_4_ = 0; (int)global < *(int *)((long)iso_grid->cell + 0x1c);
              global._0_4_ = (int)global + 1) {
            if (((-1 < (int)global) && ((int)global < *(int *)((long)iso_grid->cell + 0x1c))) &&
               ((&iso_grid->cell[5]->type)[*(int *)&iso_grid->node * (int)global] != ~REF_CELL_EDG))
            {
              local_2ac = 0;
              for (local_288 = 0; local_288 < *(int *)((long)iso_grid->cell + 4);
                  local_288 = local_288 + 1) {
                for (local_28c = 0; local_28c < 4; local_28c = local_28c + 1) {
                  (&local_2a8)[local_28c] =
                       (&iso_grid->cell[5]->type)
                       [(int)((&iso_grid->cell[2]->type)[local_28c + local_288 * 4] +
                             *(int *)&iso_grid->node * (int)global)];
                }
                uVar2 = ref_face_with(_face,(REF_INT *)&local_2a8,&j);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x2b9,"ref_iso_cast",(ulong)uVar2,"get face");
                  return uVar2;
                }
                if (*(int *)((long)local_98 + (long)j * 4) != -1) {
                  new_nodes_1[(long)local_2ac + 0x1a] = j;
                  local_2ac = local_2ac + 1;
                }
              }
              if (local_2ac == 2) {
                ref_private_macro_code_rss_15 =
                     *(REF_STATUS *)((long)local_98 + (long)new_nodes_1[0x1a] * 4);
                new_cell_1 = *(REF_INT *)((long)local_98 + (long)local_2c4 * 4);
                new_nodes_1[0] = 1;
                uVar2 = ref_cell_add((REF_CELL)ref_edge->adj,&ref_private_macro_code_rss_15,
                                     &ref_private_macro_code_rss_16);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x2c3,"ref_iso_cast",(ulong)uVar2,"add");
                  return uVar2;
                }
              }
            }
          }
        }
        else {
          iso_grid = (REF_GRID)field_local[5];
          for (global._0_4_ = 0; (int)global < *(int *)((long)iso_grid->cell + 0x1c);
              global._0_4_ = (int)global + 1) {
            if (((-1 < (int)global) && ((int)global < *(int *)((long)iso_grid->cell + 0x1c))) &&
               ((&iso_grid->cell[5]->type)[*(int *)&iso_grid->node * (int)global] != ~REF_CELL_EDG))
            {
              edges[1] = 0;
              for (edge_nodes[1] = 0; edge_nodes[1] < *(int *)iso_grid->cell;
                  edge_nodes[1] = edge_nodes[1] + 1) {
                for (edge_nodes[0] = 0; edge_nodes[0] < 2; edge_nodes[0] = edge_nodes[0] + 1) {
                  edges[(long)edge_nodes[0] + 2] =
                       (&iso_grid->cell[5]->type)
                       [(int)((&iso_grid->cell[1]->type)[edge_nodes[0] + edge_nodes[1] * 2] +
                             *(int *)&iso_grid->node * (int)global)];
                }
                uVar2 = ref_edge_with((REF_EDGE)ref_face,edges[2],nedge,&i);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x2a1,"ref_iso_cast",(ulong)uVar2,"get edge");
                  return uVar2;
                }
                if (*(int *)((long)local_98 + (long)i * 4) != -1) {
                  local_200[edges[1]] = i;
                  edges[1] = edges[1] + 1;
                }
              }
              if (edges[1] == 2) {
                ref_private_macro_code_rss_13 =
                     *(REF_STATUS *)((long)local_98 + (long)local_200[0] * 4);
                new_cell = *(REF_INT *)((long)local_98 + (long)local_200[1] * 4);
                new_nodes[0] = 1;
                uVar2 = ref_cell_add((REF_CELL)ref_edge->adj,&ref_private_macro_code_rss_13,
                                     &ref_private_macro_code_rss_14);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x2ab,"ref_iso_cast",(ulong)uVar2,"add");
                  return uVar2;
                }
              }
            }
          }
        }
        if ((_face == (REF_FACE)0x0) || (uVar2 = ref_face_free(_face), uVar2 == 0)) {
          if ((ref_face == (REF_FACE)0x0) || (uVar2 = ref_edge_free((REF_EDGE)ref_face), uVar2 == 0)
             ) {
            if (local_98 != (void *)0x0) {
              free(local_98);
            }
            iso_grid_ptr_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x2cc,"ref_iso_cast",(ulong)uVar2,"free");
            iso_grid_ptr_local._4_4_ = uVar2;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 0x2c9,"ref_iso_cast",(ulong)uVar2,"free");
          iso_grid_ptr_local._4_4_ = uVar2;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x218
               ,"ref_iso_cast",(ulong)uVar2,"zero glob");
        iso_grid_ptr_local._4_4_ = uVar2;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x215,
             "ref_iso_cast",(ulong)uVar2,"create");
      iso_grid_ptr_local._4_4_ = uVar2;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x213,
           "ref_iso_cast",(ulong)uVar2,"sync glob");
    iso_grid_ptr_local._4_4_ = uVar2;
  }
  return iso_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_iso_cast(REF_GRID *iso_grid_ptr, REF_DBL **iso_field_ptr,
                                REF_GRID ref_grid, REF_DBL *field, REF_INT ldim,
                                REF_DBL *segment0, REF_DBL *segment1) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = NULL;
  REF_GRID iso_grid;
  REF_EDGE ref_edge = NULL;
  REF_FACE ref_face = NULL;
  REF_INT edge, face, i, j, part, cell;
  REF_GLOB global;
  REF_INT *new_node = NULL;
  REF_DBL candidate0[3], candidate1[3];
  REF_DBL triangle0[3], triangle1[3], triangle2[3];
  REF_DBL tt[2], ss[2], tuvw[4];
  REF_DBL inside = 0.0;
  REF_DBL t0, t1;
  REF_INT id = 1;
  REF_DBL *iso_field;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  RSS(ref_grid_create(iso_grid_ptr, ref_mpi), "create");
  iso_grid = *iso_grid_ptr;
  ref_grid_twod(iso_grid) = ref_grid_twod(ref_grid);
  RSS(ref_node_initialize_n_global(ref_grid_node(iso_grid), 0), "zero glob");

  if (ref_grid_twod(ref_grid)) {
    RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
    ref_malloc_init(new_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
    each_ref_edge(ref_edge, edge) {
      for (i = 0; i < 3; i++) {
        candidate0[i] =
            ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 0, edge));
        candidate1[i] =
            ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 1, edge));
      }
      if (REF_SUCCESS != ref_iso_segment_segment(candidate0, candidate1,
                                                 segment0, segment1, tt))
        continue;
      ss[0] = 1.0 - tt[0];
      ss[1] = 1.0 - tt[1];
      if (MIN(tt[0], ss[0]) < inside) continue;
      if (MIN(tt[1], ss[1]) < inside) continue;

      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_next_global(ref_grid_node(iso_grid), &global),
            "next global");
        RSS(ref_node_add(ref_grid_node(iso_grid), global, &(new_node[edge])),
            "add node");
        for (i = 0; i < 3; i++) {
          ref_node_xyz(ref_grid_node(iso_grid), i, new_node[edge]) =
              ss[1] * candidate1[i] + tt[1] * candidate0[i];
        }
      }
    }
  } else {
    RSS(ref_face_create(&ref_face, ref_grid), "create face");
    ref_malloc_init(new_node, ref_face_n(ref_face), REF_INT, REF_EMPTY);

    each_ref_face(ref_face, face) {
      for (i = 0; i < 3; i++) {
        triangle0[i] =
            ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 0, face));
        triangle1[i] =
            ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 1, face));
        triangle2[i] =
            ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 2, face));
      }
      if (REF_SUCCESS != ref_iso_triangle_segment(triangle0, triangle1,
                                                  triangle2, segment0, segment1,
                                                  tuvw))
        continue;
      if (MIN(MIN(tuvw[1], tuvw[2]), tuvw[3]) < inside) continue;
      /* exclude intersections outside of segment */
      if (MIN(tuvw[0], 1.0 - tuvw[0]) < inside) continue;

      RSS(ref_face_part(ref_face, ref_node, face, &part), "face part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_next_global(ref_grid_node(iso_grid), &global),
            "next global");
        RSS(ref_node_add(ref_grid_node(iso_grid), global, &(new_node[face])),
            "add node");
        t1 = tuvw[0];
        t0 = 1.0 - t1;
        for (i = 0; i < 3; i++) {
          ref_node_xyz(ref_grid_node(iso_grid), i, new_node[face]) =
              t1 * segment1[i] + t0 * segment0[i];
        }
      }
    }
  }
  if (NULL == field) {
    *iso_field_ptr = NULL;
  } else {
    REF_INT node;
    ref_malloc(*iso_field_ptr, ldim * ref_node_max(ref_grid_node(iso_grid)),
               REF_DBL);
    iso_field = *iso_field_ptr;
    if (ref_grid_twod(ref_grid)) {
      each_ref_edge(ref_edge, edge) {
        node = new_node[edge];
        if (REF_EMPTY != node) {
          for (i = 0; i < 3; i++) {
            candidate0[i] =
                ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 0, edge));
            candidate1[i] =
                ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 1, edge));
          }
          RSS(ref_iso_segment_segment(candidate0, candidate1, segment0,
                                      segment1, tt),
              "seg-seg");
          ss[0] = 1.0 - tt[0];
          ss[1] = 1.0 - tt[1];
          for (j = 0; j < ldim; j++) {
            iso_field[j + ldim * node] =
                ss[1] * field[j + ldim * ref_edge_e2n(ref_edge, 0, edge)] +
                tt[1] * field[j + ldim * ref_edge_e2n(ref_edge, 1, edge)];
          }
        }
      }
    } else {
      each_ref_face(ref_face, face) {
        node = new_node[face];
        if (REF_EMPTY != node) {
          for (i = 0; i < 3; i++) {
            triangle0[i] =
                ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 0, face));
            triangle1[i] =
                ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 1, face));
            triangle2[i] =
                ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 2, face));
          }
          RSS(ref_iso_triangle_segment(triangle0, triangle1, triangle2,
                                       segment0, segment1, tuvw),
              "tuvw");
          for (j = 0; j < ldim; j++) {
            iso_field[j + ldim * node] = 0.0;
            for (i = 0; i < 3; i++) {
              iso_field[j + ldim * node] +=
                  tuvw[i + 1] *
                  field[j + ldim * ref_face_f2n(ref_face, i, face)];
            }
          }
        }
      }
    }
  }

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell(ref_cell, cell) {
      REF_INT cell_edge, node, edge_nodes[2];
      REF_INT nedge, edges[3];
      REF_INT new_nodes[REF_CELL_MAX_SIZE_PER], new_cell;
      nedge = 0;
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        for (node = 0; node < 2; node++) {
          edge_nodes[node] = ref_cell_e2n(ref_cell, node, cell_edge, cell);
        }
        RSS(ref_edge_with(ref_edge, edge_nodes[0], edge_nodes[1], &edge),
            "get edge");
        if (REF_EMPTY != new_node[edge]) {
          edges[nedge] = edge;
          nedge++;
        }
      }
      if (2 == nedge) {
        new_nodes[0] = new_node[edges[0]];
        new_nodes[1] = new_node[edges[1]];
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
    }
  } else {
    ref_cell = ref_grid_tet(ref_grid);
    each_ref_cell_valid_cell(ref_cell, cell) {
      REF_INT cell_face, node, face_nodes[4];
      REF_INT nface, faces[4];
      REF_INT new_nodes[REF_CELL_MAX_SIZE_PER], new_cell;
      nface = 0;
      each_ref_cell_cell_face(ref_cell, cell_face) {
        for (node = 0; node < 4; node++) {
          face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        }
        RSS(ref_face_with(ref_face, face_nodes, &face), "get face");
        if (REF_EMPTY != new_node[face]) {
          faces[nface] = face;
          nface++;
        }
      }
      if (2 == nface) {
        new_nodes[0] = new_node[faces[0]];
        new_nodes[1] = new_node[faces[1]];
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
    }
  }

  if (NULL != ref_face) {
    RSS(ref_face_free(ref_face), "free");
  }
  if (NULL != ref_edge) {
    RSS(ref_edge_free(ref_edge), "free");
  }
  ref_free(new_node);
  return REF_SUCCESS;
}